

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<cs::object_method> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::object_method>,64ul,cs_impl::default_allocator_provider>
::alloc<cs_impl::any,cs_impl::any>
          (allocator_type<cs_impl::any::holder<cs::object_method>,64ul,cs_impl::default_allocator_provider>
           *this,any *args,any *args_1)

{
  long lVar1;
  holder<cs::object_method> *this_00;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    this_00 = (holder<cs::object_method> *)operator_new(0x20);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    this_00 = *(holder<cs::object_method> **)(this + lVar1 * 8 + -8);
  }
  cs_impl::any::holder<cs::object_method>::holder<cs_impl::any,cs_impl::any>(this_00,args,args_1);
  return this_00;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}